

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_switches.cpp
# Opt level: O1

void __thiscall FTextureManager::ProcessSwitchDef(FTextureManager *this,FScanner *sc)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  FTextureID FVar4;
  undefined7 extraout_var;
  FSwitchDef *def1;
  bool ignoreBad;
  FString picname;
  EGameType local_54;
  FSwitchDef *local_48;
  FString local_40;
  undefined8 local_38;
  
  local_40.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  FScanner::MustGetString(sc);
  bVar2 = FScanner::Compare(sc,"doom");
  if (bVar2) {
    FScanner::CheckNumber(sc);
    local_54 = GAME_DoomChex;
  }
  else {
    bVar2 = FScanner::Compare(sc,"heretic");
    if (bVar2) {
      local_54 = GAME_Heretic;
    }
    else {
      bVar2 = FScanner::Compare(sc,"hexen");
      if (bVar2) {
        local_54 = GAME_Hexen;
      }
      else {
        bVar2 = FScanner::Compare(sc,"strife");
        if (!bVar2) {
          bVar3 = FScanner::Compare(sc,"any");
          local_54 = GAME_Any;
          bVar2 = true;
          if (!bVar3) {
            FScanner::UnGet(sc);
          }
          goto LAB_006100fb;
        }
        local_54 = GAME_Strife;
      }
    }
  }
  bVar2 = false;
LAB_006100fb:
  FScanner::MustGetString(sc);
  FVar4 = CheckForTexture(this,sc->String,1,3);
  FString::operator=(&local_40,sc->String);
  local_38 = 0;
  local_48 = (FSwitchDef *)0x0;
  def1 = (FSwitchDef *)0x0;
LAB_00610155:
  do {
    bVar3 = FScanner::GetString(sc);
    if (!bVar3) {
LAB_00610233:
      if ((FVar4.texnum < 0 || def1 == (FSwitchDef *)0x0) ||
         ((!bVar2 && ((gameinfo.gametype & local_54) == GAME_Any)))) {
        if (local_48 != (FSwitchDef *)0x0) {
          M_Free(local_48);
        }
        if (def1 != (FSwitchDef *)0x0) {
          M_Free(def1);
        }
      }
      else {
        if (local_48 == (FSwitchDef *)0x0) {
          local_48 = (FSwitchDef *)
                     M_Malloc_Dbg(0x20,
                                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/textures/anim_switches.cpp"
                                  ,0xc9);
          local_48->Sound = def1->Sound;
          local_48->NumFrames = 1;
          local_48->frames[0].TimeMin = 0;
          local_48->frames[0].TimeRnd = 0;
          local_48->frames[0].Texture.texnum = FVar4.texnum;
        }
        (def1->PreTexture).texnum = FVar4.texnum;
        iVar1 = def1->frames[(ulong)def1->NumFrames - 1].Texture.texnum;
        (local_48->PreTexture).texnum = iVar1;
        if ((def1->PreTexture).texnum == iVar1) {
          FScanner::ScriptError
                    (sc,"The on state for switch %s must end with a texture other than %s",
                     local_40.Chars);
        }
        AddSwitchPair(this,def1,local_48);
        local_48->QuestPanel = SUB81(local_38,0);
        def1->QuestPanel = SUB81(local_38,0);
      }
      FString::~FString(&local_40);
      return;
    }
    bVar3 = FScanner::Compare(sc,"quest");
    if (!bVar3) {
      bVar3 = FScanner::Compare(sc,"on");
      ignoreBad = SUB41((uint)FVar4.texnum >> 0x1f,0);
      if (bVar3) {
        if (def1 != (FSwitchDef *)0x0) {
          FScanner::ScriptError(sc,"Switch already has an on state");
        }
        def1 = ParseSwitchDef(this,sc,ignoreBad);
      }
      else {
        bVar3 = FScanner::Compare(sc,"off");
        if (!bVar3) {
          FScanner::UnGet(sc);
          goto LAB_00610233;
        }
        if (local_48 != (FSwitchDef *)0x0) {
          FScanner::ScriptError(sc,"Switch already has an off state");
        }
        local_48 = ParseSwitchDef(this,sc,ignoreBad);
      }
      goto LAB_00610155;
    }
    local_38 = CONCAT71(extraout_var,1);
  } while( true );
}

Assistant:

void FTextureManager::ProcessSwitchDef (FScanner &sc)
{
	const BITFIELD texflags = TEXMAN_Overridable | TEXMAN_TryAny;
	FString picname;
	FSwitchDef *def1, *def2;
	FTextureID picnum;
	int gametype;
	bool quest = false;

	def1 = def2 = NULL;
	sc.MustGetString ();
	if (sc.Compare ("doom"))
	{
		gametype = GAME_DoomChex;
		sc.CheckNumber();	// skip the gamemission filter
	}
	else if (sc.Compare ("heretic"))
	{
		gametype = GAME_Heretic;
	}
	else if (sc.Compare ("hexen"))
	{
		gametype = GAME_Hexen;
	}
	else if (sc.Compare ("strife"))
	{
		gametype = GAME_Strife;
	}
	else if (sc.Compare ("any"))
	{
		gametype = GAME_Any;
	}
	else
	{
		// There is no game specified; just treat as any
		//max = 240;
		gametype = GAME_Any;
		sc.UnGet ();
	}

	sc.MustGetString ();
	picnum = CheckForTexture (sc.String, FTexture::TEX_Wall, texflags);
	picname = sc.String;
	while (sc.GetString ())
	{
		if (sc.Compare ("quest"))
		{
			quest = true;
		}
		else if (sc.Compare ("on"))
		{
			if (def1 != NULL)
			{
				sc.ScriptError ("Switch already has an on state");
			}
			def1 = ParseSwitchDef (sc, !picnum.Exists());
		}
		else if (sc.Compare ("off"))
		{
			if (def2 != NULL)
			{
				sc.ScriptError ("Switch already has an off state");
			}
			def2 = ParseSwitchDef (sc, !picnum.Exists());
		}
		else
		{
			sc.UnGet ();
			break;
		}
	}

	if (def1 == NULL || !picnum.Exists() ||
		(gametype != GAME_Any && !(gametype & gameinfo.gametype)))
	{
		if (def2 != NULL)
		{
			M_Free (def2);
		}
		if (def1 != NULL)
		{
			M_Free (def1);
		}
		return;
	}

	// If the switch did not have an off state, create one that just returns
	// it to the original texture without doing anything interesting
	if (def2 == NULL)
	{
		def2 = (FSwitchDef *)M_Malloc (sizeof(FSwitchDef));
		def2->Sound = def1->Sound;
		def2->NumFrames = 1;
		def2->frames[0].TimeMin = 0;
		def2->frames[0].TimeRnd = 0;
		def2->frames[0].Texture = picnum;
	}

	def1->PreTexture = picnum;
	def2->PreTexture = def1->frames[def1->NumFrames-1].Texture;
	if (def1->PreTexture == def2->PreTexture)
	{
		sc.ScriptError ("The on state for switch %s must end with a texture other than %s", picname.GetChars(), picname.GetChars());
	}
	AddSwitchPair(def1, def2);
	def1->QuestPanel = def2->QuestPanel = quest;
}